

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O2

int32 rw::xbox::getSizeNativeSkin(void *object,int32 offset)

{
  int iVar1;
  int iVar2;
  Skin *skin;
  int32 iVar3;
  int iVar4;
  Geometry *geometry;
  
  skin = *(Skin **)((long)object + (long)offset);
  iVar4 = -1;
  if ((skin != (Skin *)0x0) && (skin->platformData != (void *)0x0)) {
    iVar4 = *(int *)((long)object + 0x1c);
    iVar1 = *(int *)((long)skin->platformData + 0x810);
    iVar2 = skin->numBones;
    iVar3 = skinSplitDataSize(skin);
    iVar4 = iVar3 + iVar2 * 0x40 + iVar4 * iVar1 + 0x824;
  }
  return iVar4;
}

Assistant:

int32
getSizeNativeSkin(void *object, int32 offset)
{
	Geometry *geometry = (Geometry*)object;
	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	if(skin == nil)
		return -1;
	if(skin->platformData == nil)
		return -1;
	NativeSkin *natskin = (NativeSkin*)skin->platformData;
	return 12 + 8 + 2*256*4 + 4*4 +
	        natskin->stride*geometry->numVertices + skin->numBones*64 +
		skinSplitDataSize(skin);
}